

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::util_IsHex::test_method(util_IsHex *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  check_type cVar4;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1c0;
  file.m_begin = (iterator)&local_48;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  str._M_str = "00";
  str._M_len = 2;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsHex(str);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "IsHex(\"00\")";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_b0,0x1c0);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1c1;
  file_00.m_begin = (iterator)&local_c0;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  str_00._M_str = "00112233445566778899aabbccddeeffAABBCCDDEEFF";
  str_00._M_len = 0x2c;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsHex(str_00);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "IsHex(\"00112233445566778899aabbccddeeffAABBCCDDEEFF\")";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_e0,0x1c1);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1c2;
  file_01.m_begin = (iterator)&local_f0;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_100,
             msg_01);
  str_01._M_str = "ff";
  str_01._M_len = 2;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsHex(str_01);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "IsHex(\"ff\")";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_108 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_110,0x1c2);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1c3;
  file_02.m_begin = (iterator)&local_120;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_130,
             msg_02);
  str_02._M_str = "FF";
  str_02._M_len = 2;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsHex(str_02);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "IsHex(\"FF\")";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_138 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_140,0x1c3);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1c5;
  file_03.m_begin = (iterator)&local_150;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_160,
             msg_03);
  bVar1 = IsHex((string_view)(ZEXT816(0xf4aea1) << 0x40));
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!IsHex(\"\")";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_168 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_170,0x1c5);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1c6;
  file_04.m_begin = (iterator)&local_180;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_190,
             msg_04);
  str_03._M_str = "0";
  str_03._M_len = 1;
  bVar1 = IsHex(str_03);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!IsHex(\"0\")";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_198 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_1a0,0x1c6);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x1c7;
  file_05.m_begin = (iterator)&local_1b0;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c0,
             msg_05);
  str_04._M_str = "a";
  str_04._M_len = 1;
  bVar1 = IsHex(str_04);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!IsHex(\"a\")";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_1d0,0x1c7);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1c8;
  file_06.m_begin = (iterator)&local_1e0;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f0,
             msg_06);
  str_05._M_str = "eleven";
  str_05._M_len = 6;
  bVar1 = IsHex(str_05);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!IsHex(\"eleven\")";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_200,0x1c8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x1c9;
  file_07.m_begin = (iterator)&local_210;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_220,
             msg_07);
  str_06._M_str = "00xx00";
  str_06._M_len = 6;
  bVar1 = IsHex(str_06);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!IsHex(\"00xx00\")";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_228 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_230,0x1c9);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1ca;
  file_08.m_begin = (iterator)&local_240;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_250,
             msg_08);
  str_07._M_str = "0x0000";
  str_07._M_len = 6;
  bVar1 = IsHex(str_07);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!IsHex(\"0x0000\")";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,0xf4a348,(size_t)&stack0xfffffffffffffda0,0x1ca);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_IsHex)
{
    BOOST_CHECK(IsHex("00"));
    BOOST_CHECK(IsHex("00112233445566778899aabbccddeeffAABBCCDDEEFF"));
    BOOST_CHECK(IsHex("ff"));
    BOOST_CHECK(IsHex("FF"));

    BOOST_CHECK(!IsHex(""));
    BOOST_CHECK(!IsHex("0"));
    BOOST_CHECK(!IsHex("a"));
    BOOST_CHECK(!IsHex("eleven"));
    BOOST_CHECK(!IsHex("00xx00"));
    BOOST_CHECK(!IsHex("0x0000"));
}